

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

UnicodeString ** __thiscall
icu_63::DateFormatSymbols::getZoneStrings
          (DateFormatSymbols *this,int32_t *rowCount,int32_t *columnCount)

{
  UnicodeString **local_28;
  UnicodeString **result;
  int32_t *columnCount_local;
  int32_t *rowCount_local;
  DateFormatSymbols *this_local;
  
  umtx_lock_63((UMutex *)LOCK);
  if (this->fZoneStrings == (UnicodeString **)0x0) {
    if (this->fLocaleZoneStrings == (UnicodeString **)0x0) {
      initZoneStringsArray(this);
    }
    local_28 = this->fLocaleZoneStrings;
  }
  else {
    local_28 = this->fZoneStrings;
  }
  *rowCount = this->fZoneStringsRowCount;
  *columnCount = this->fZoneStringsColCount;
  umtx_unlock_63((UMutex *)LOCK);
  return local_28;
}

Assistant:

const UnicodeString**
DateFormatSymbols::getZoneStrings(int32_t& rowCount, int32_t& columnCount) const
{
    const UnicodeString **result = NULL;

    umtx_lock(&LOCK);
    if (fZoneStrings == NULL) {
        if (fLocaleZoneStrings == NULL) {
            ((DateFormatSymbols*)this)->initZoneStringsArray();
        }
        result = (const UnicodeString**)fLocaleZoneStrings;
    } else {
        result = (const UnicodeString**)fZoneStrings;
    }
    rowCount = fZoneStringsRowCount;
    columnCount = fZoneStringsColCount;
    umtx_unlock(&LOCK);

    return result;
}